

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorTiled::Tile::GenerateGeometry
          (Tile *this,Mesh *mesh,ComputedValues *computed,Vector2f surface_origin,
          Vector2f surface_dimensions,Vector2f tile_dimensions)

{
  float fVar1;
  Type TVar2;
  TileOrientation TVar3;
  float fVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  Vector2<float> VVar10;
  Vector2<float> *local_1b8;
  Vector2f local_178;
  Vector2f tile_position;
  float width;
  float *right;
  float *left;
  float local_140;
  float local_13c;
  float overshoot_right;
  float local_134;
  int local_130;
  float overshoot_left;
  int i_2;
  int local_124;
  Vector2<float> VStack_120;
  int i_1;
  Vector2f tile_offset;
  Vector2<float> local_110;
  Tile *local_108;
  Vector2<float> local_fc;
  Vector2<float> local_f4;
  float local_ec;
  Tile *pTStack_e8;
  float min_factor_1;
  Vector2<float> local_dc;
  Vector2f scale_factor_2;
  float max_factor;
  Vector2<float> local_bc;
  Vector2f scale_factor_1;
  float min_factor;
  Vector2<float> local_9c;
  Vector2f scale_factor;
  Vector2f repeat_factor;
  float fStack_84;
  bool offset_and_clip_tile;
  Vector2f final_tile_dimensions;
  int local_5c;
  Vector2f VStack_58;
  int i;
  Vector2f scaled_texcoords [2];
  Colourb local_40;
  Colour<unsigned_char,_255,_true> local_3c;
  ComputedValues *pCStack_38;
  ColourbPremultiplied quad_colour;
  ComputedValues *computed_local;
  Mesh *mesh_local;
  Tile *this_local;
  Vector2f tile_dimensions_local;
  Vector2f surface_dimensions_local;
  Vector2f surface_origin_local;
  
  tile_dimensions_local.x = surface_dimensions.x;
  if ((0.0 < tile_dimensions_local.x) &&
     (tile_dimensions_local.y = surface_dimensions.y, 0.0 < tile_dimensions_local.y)) {
    pCStack_38 = computed;
    this_local = (Tile *)tile_dimensions;
    tile_dimensions_local = surface_dimensions;
    surface_dimensions_local = surface_origin;
    local_40 = Style::ComputedValues::image_color(computed);
    fVar8 = Style::ComputedValues::opacity(pCStack_38);
    local_3c = Colour<unsigned_char,255,false>::
               ToPremultiplied<std::integral_constant<bool,false>,void>
                         ((Colour<unsigned_char,255,false> *)&local_40,fVar8);
    if ((this->tile_data_calculated & 1U) != 0) {
      local_1b8 = &stack0xffffffffffffffa8;
      do {
        Vector2<float>::Vector2(local_1b8);
        local_1b8 = local_1b8 + 1;
      } while (local_1b8 != scaled_texcoords + 1);
      for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
        TVar3 = this->orientation;
        VVar10.x = (this->tile_data).texcoords[0].x;
        VVar10.y = (this->tile_data).texcoords[0].y;
        VVar10 = Vector2<float>::operator-((this->tile_data).texcoords + 1,VVar10);
        VVar10 = Vector2<float>::operator*
                           ((Vector2<float> *)
                            (oriented_texcoords + (long)local_5c * 8 + (ulong)TVar3 * 0x10),VVar10);
        VVar10 = Vector2<float>::operator+((this->tile_data).texcoords,VVar10);
        *(Vector2<float> *)((long)&stack0xffffffffffffffa8 + (long)local_5c * 8) = VVar10;
      }
      Vector2<float>::Vector2((Vector2<float> *)&repeat_factor.y);
      repeat_factor.x._3_1_ = 0;
      Vector2<float>::Vector2(&scale_factor,1.0);
      switch(this->fit_mode) {
      case FILL:
        repeat_factor.y = tile_dimensions_local.x;
        fStack_84 = tile_dimensions_local.y;
        break;
      case CONTAIN:
        local_9c = Vector2<float>::operator/(&tile_dimensions_local,(Vector2<float>)this_local);
        pfVar5 = ::std::min<float>(&local_9c.x,&local_9c.y);
        scale_factor_1 = Vector2<float>::operator*((Vector2<float> *)&this_local,*pfVar5);
        repeat_factor.x._3_1_ = 1;
        unique0x10000b6a = scale_factor_1;
        break;
      case COVER:
        local_bc = Vector2<float>::operator/(&tile_dimensions_local,(Vector2<float>)this_local);
        pfVar5 = ::std::max<float>(&local_bc.x,&local_bc.y);
        scale_factor_2 = Vector2<float>::operator*((Vector2<float> *)&this_local,*pfVar5);
        repeat_factor.x._3_1_ = 1;
        unique0x10000b62 = scale_factor_2;
        break;
      case SCALE_NONE:
        stack0xffffffffffffff78 = (Vector2<float>)this_local;
        repeat_factor.x._3_1_ = 1;
        break;
      case SCALE_DOWN:
        pTStack_e8 = this_local;
        local_dc = Vector2<float>::operator/(&tile_dimensions_local,(Vector2<float>)this_local);
        pfVar5 = ::std::min<float>(&local_dc.x,&local_dc.y);
        local_ec = *pfVar5;
        if (1.0 <= local_ec) {
          stack0xffffffffffffff78 = (Vector2<float>)this_local;
        }
        else {
          local_f4 = Vector2<float>::operator*((Vector2<float> *)&this_local,local_ec);
          unique0x10000b5a = local_f4;
        }
        repeat_factor.x._3_1_ = 1;
        break;
      case REPEAT:
        repeat_factor.y = tile_dimensions_local.x;
        fStack_84 = tile_dimensions_local.y;
        local_108 = this_local;
        local_fc = Vector2<float>::operator/(&tile_dimensions_local,(Vector2<float>)this_local);
        scale_factor = local_fc;
        break;
      case REPEAT_X:
        Vector2<float>::Vector2(&local_110,tile_dimensions_local.x,this_local._4_4_);
        stack0xffffffffffffff78 = local_110;
        scale_factor.x = tile_dimensions_local.x / this_local._0_4_;
        repeat_factor.x._3_1_ = 1;
        break;
      case REPEAT_Y:
        Vector2<float>::Vector2(&tile_offset,this_local._0_4_,tile_dimensions_local.y);
        repeat_factor.y = tile_offset.x;
        fStack_84 = tile_offset.y;
        scale_factor.y = tile_dimensions_local.y / this_local._4_4_;
        repeat_factor.x._3_1_ = 1;
      }
      Vector2<float>::Vector2(&stack0xfffffffffffffee0,0.0,0.0);
      if ((repeat_factor.x._3_1_ & 1) != 0) {
        for (local_124 = 0; local_124 < 2; local_124 = local_124 + 1) {
          TVar2 = this->align[local_124].type;
          if (TVar2 == Length) {
            fVar8 = this->align[local_124].value;
            pfVar5 = Vector2::operator_cast_to_float_((Vector2 *)&stack0xfffffffffffffee0);
            pfVar5[local_124] = fVar8;
          }
          else if (TVar2 == Percentage) {
            pfVar5 = Vector2::operator_cast_to_float_((Vector2 *)&tile_dimensions_local);
            fVar8 = pfVar5[local_124];
            pfVar5 = Vector2::operator_cast_to_float_((Vector2 *)&repeat_factor.y);
            fVar9 = pfVar5[local_124];
            fVar1 = this->align[local_124].value;
            pfVar5 = Vector2::operator_cast_to_float_((Vector2 *)&stack0xfffffffffffffee0);
            pfVar5[local_124] = (fVar8 - fVar9) * fVar1 * 0.01;
          }
        }
        _overshoot_left = Vector2<float>::Round(&stack0xfffffffffffffee0);
        VStack_120 = _overshoot_left;
        for (local_130 = 0; local_130 < 2; local_130 = local_130 + 1) {
          pfVar5 = Vector2::operator_cast_to_float_((Vector2 *)&stack0xfffffffffffffee0);
          overshoot_right = -pfVar5[local_130];
          local_13c = 0.0;
          pfVar5 = ::std::max<float>(&overshoot_right,&local_13c);
          local_134 = *pfVar5;
          pfVar5 = Vector2::operator_cast_to_float_((Vector2 *)&stack0xfffffffffffffee0);
          fVar8 = pfVar5[local_130];
          pfVar5 = Vector2::operator_cast_to_float_((Vector2 *)&repeat_factor.y);
          fVar9 = pfVar5[local_130];
          pfVar5 = Vector2::operator_cast_to_float_((Vector2 *)&tile_dimensions_local);
          left._4_4_ = (fVar8 + fVar9) - pfVar5[local_130];
          left._0_4_ = 0;
          pfVar5 = ::std::max<float>((float *)((long)&left + 4),(float *)&left);
          local_140 = *pfVar5;
          if ((0.0 < local_134) || (0.0 < local_140)) {
            pfVar5 = Vector2::operator_cast_to_float_((Vector2 *)&stack0xffffffffffffffa8);
            pfVar5 = pfVar5 + local_130;
            pfVar6 = Vector2::operator_cast_to_float_((Vector2 *)scaled_texcoords);
            fVar4 = local_134;
            pfVar6 = pfVar6 + local_130;
            fVar8 = *pfVar6;
            fVar9 = *pfVar5;
            pfVar7 = Vector2::operator_cast_to_float_((Vector2 *)&repeat_factor.y);
            fVar1 = local_140;
            *pfVar5 = (fVar4 / pfVar7[local_130]) * (fVar8 - fVar9) + *pfVar5;
            pfVar5 = Vector2::operator_cast_to_float_((Vector2 *)&repeat_factor.y);
            *pfVar6 = -(fVar1 / pfVar5[local_130]) * (fVar8 - fVar9) + *pfVar6;
            fVar9 = local_134 + local_140;
            pfVar5 = Vector2::operator_cast_to_float_((Vector2 *)&repeat_factor.y);
            fVar8 = local_134;
            pfVar5[local_130] = pfVar5[local_130] - fVar9;
            pfVar5 = Vector2::operator_cast_to_float_((Vector2 *)&stack0xfffffffffffffee0);
            pfVar5[local_130] = fVar8 + pfVar5[local_130];
          }
        }
      }
      Vector2<float>::operator*=(&stack0xffffffffffffffa8,scale_factor);
      tile_position = scale_factor;
      Vector2<float>::operator*=(scaled_texcoords,scale_factor);
      local_178 = Vector2<float>::operator+(&surface_dimensions_local,VStack_120);
      Math::SnapToPixelGrid(&local_178,(Vector2f *)&repeat_factor.y);
      MeshUtilities::GenerateQuad
                (mesh,local_178,stack0xffffffffffffff78,local_3c,VStack_58,scaled_texcoords[0]);
    }
  }
  return;
}

Assistant:

void DecoratorTiled::Tile::GenerateGeometry(Mesh& mesh, const ComputedValues& computed, const Vector2f surface_origin,
	const Vector2f surface_dimensions, const Vector2f tile_dimensions) const
{
	if (surface_dimensions.x <= 0 || surface_dimensions.y <= 0)
		return;

	const ColourbPremultiplied quad_colour = computed.image_color().ToPremultiplied(computed.opacity());

	if (!tile_data_calculated)
		return;

	// Generate the oriented texture coordinates for the tiles.
	Vector2f scaled_texcoords[2];
	for (int i = 0; i < 2; i++)
	{
		scaled_texcoords[i] = tile_data.texcoords[0] + oriented_texcoords[orientation][i] * (tile_data.texcoords[1] - tile_data.texcoords[0]);
	}

	Vector2f final_tile_dimensions;
	bool offset_and_clip_tile = false;
	Vector2f repeat_factor = Vector2f(1);

	switch (fit_mode)
	{
	case FILL:
	{
		final_tile_dimensions = surface_dimensions;
	}
	break;
	case CONTAIN:
	{
		Vector2f scale_factor = surface_dimensions / tile_dimensions;
		float min_factor = std::min(scale_factor.x, scale_factor.y);
		final_tile_dimensions = tile_dimensions * min_factor;

		offset_and_clip_tile = true;
	}
	break;
	case COVER:
	{
		Vector2f scale_factor = surface_dimensions / tile_dimensions;
		float max_factor = std::max(scale_factor.x, scale_factor.y);
		final_tile_dimensions = tile_dimensions * max_factor;

		offset_and_clip_tile = true;
	}
	break;
	case SCALE_NONE:
	{
		final_tile_dimensions = tile_dimensions;

		offset_and_clip_tile = true;
	}
	break;
	case SCALE_DOWN:
	{
		Vector2f scale_factor = surface_dimensions / tile_dimensions;
		float min_factor = std::min(scale_factor.x, scale_factor.y);
		if (min_factor < 1.0f)
			final_tile_dimensions = tile_dimensions * min_factor;
		else
			final_tile_dimensions = tile_dimensions;

		offset_and_clip_tile = true;
	}
	break;
	case REPEAT:
		final_tile_dimensions = surface_dimensions;
		repeat_factor = surface_dimensions / tile_dimensions;
		break;
	case REPEAT_X:
		final_tile_dimensions = Vector2f(surface_dimensions.x, tile_dimensions.y);
		repeat_factor.x = surface_dimensions.x / tile_dimensions.x;
		offset_and_clip_tile = true;
		break;
	case REPEAT_Y:
		final_tile_dimensions = Vector2f(tile_dimensions.x, surface_dimensions.y);
		repeat_factor.y = surface_dimensions.y / tile_dimensions.y;
		offset_and_clip_tile = true;
		break;
	}

	Vector2f tile_offset(0, 0);

	if (offset_and_clip_tile)
	{
		// Offset tile along each dimension.
		for (int i = 0; i < 2; i++)
		{
			switch (align[i].type)
			{
			case Style::LengthPercentage::Length: tile_offset[i] = align[i].value; break;
			case Style::LengthPercentage::Percentage:
				tile_offset[i] = (surface_dimensions[i] - final_tile_dimensions[i]) * align[i].value * 0.01f;
				break;
			}
		}
		tile_offset = tile_offset.Round();

		// Clip tile. See if our tile extends outside the boundary at either side, along each dimension.
		for (int i = 0; i < 2; i++)
		{
			// Left/right acts as top/bottom during the second iteration.
			float overshoot_left = std::max(-tile_offset[i], 0.0f);
			float overshoot_right = std::max(tile_offset[i] + final_tile_dimensions[i] - surface_dimensions[i], 0.0f);

			if (overshoot_left > 0.f || overshoot_right > 0.f)
			{
				float& left = scaled_texcoords[0][i];
				float& right = scaled_texcoords[1][i];
				float width = right - left;

				left += overshoot_left / final_tile_dimensions[i] * width;
				right -= overshoot_right / final_tile_dimensions[i] * width;

				final_tile_dimensions[i] -= overshoot_left + overshoot_right;
				tile_offset[i] += overshoot_left;
			}
		}
	}

	scaled_texcoords[0] *= repeat_factor;
	scaled_texcoords[1] *= repeat_factor;

	// Generate the vertices for the tiled surface.
	Vector2f tile_position = (surface_origin + tile_offset);
	Math::SnapToPixelGrid(tile_position, final_tile_dimensions);

	MeshUtilities::GenerateQuad(mesh, tile_position, final_tile_dimensions, quad_colour, scaled_texcoords[0], scaled_texcoords[1]);
}